

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test::
~TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test
          (TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test *this)

{
  TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test *this_local;
  
  ~TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, freeOnlyTheMemoryInTheAllocationStage)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    detector->increaseAllocationStage();
    detector->allocMemory(defaultMallocAllocator(), 2);
    detector->deallocAllMemoryInCurrentAllocationStage();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}